

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O2

int __thiscall GdlPass::MachineClassKey(GdlPass *this,gid16 wGlyphID,int nPassID)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  undefined2 in_register_00000032;
  
  iVar2 = 0;
  for (p_Var1 = this->m_rgscsInclusions[CONCAT22(in_register_00000032,wGlyphID)]._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &this->m_rgscsInclusions[CONCAT22(in_register_00000032,wGlyphID)]._M_t._M_impl.
       super__Rb_tree_header; p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    iVar2 = iVar2 + *(int *)(*(long *)(*(long *)(p_Var1 + 1) + 0xe8) + (long)nPassID * 4);
  }
  return iVar2;
}

Assistant:

int GdlPass::MachineClassKey(gid16 wGlyphID, int nPassID)
{
	SourceClassSet * pscs = m_rgscsInclusions + wGlyphID;
	int nKey = 0;
	for (SourceClassSet::iterator itscs = pscs->begin();
		itscs != pscs->end();
		++itscs)
	{
		Assert((*itscs)->FsmID(nPassID) > -1);
		nKey += (*itscs)->FsmID(nPassID);
	}
	return nKey;
}